

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::checkIntDivByZero(CheckerVisitor *this,BinExpr *bin)

{
  _func_int **pp_Var1;
  undefined8 in_RAX;
  Expr *pEVar2;
  Expr *pEVar3;
  int32_t id;
  LiteralExpr *lhs;
  int32_t dummy;
  int32_t dummy_1;
  int32_t local_28;
  int32_t local_24;
  
  if ((this->effectsOnly == false) &&
     (((bin->super_Expr).super_Node._op - TO_DIV & 0xfffffff6) == 0)) {
    _local_28 = CONCAT44((int32_t)((ulong)in_RAX >> 0x20),0xffffffff);
    pEVar2 = maybeEval(this,bin->_lhs,&local_28,false);
    _local_28 = CONCAT44(0xffffffff,local_28);
    pEVar3 = maybeEval(this,bin->_rhs,&local_24,false);
    if ((pEVar3->super_Node)._op == TO_LITERAL) {
      pp_Var1 = pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      if (pp_Var1 == (_func_int **)0x0) {
        id = 0x56;
      }
      else {
        if ((pEVar2->super_Node)._op != TO_LITERAL) {
          return;
        }
        if (*(int *)&(pEVar2->super_Node).field_0x1c != 1) {
          return;
        }
        if (*(int *)&(pEVar3->super_Node).field_0x1c != 1) {
          return;
        }
        id = 0x57;
        if ((long)pEVar2[1].super_Node.super_ArenaObj._vptr_ArenaObj % (long)pp_Var1 == 0) {
          return;
        }
      }
      report(this,(Node *)bin,id);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkIntDivByZero(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (isDivOperator(bin->op())) {
    const Expr *divided = maybeEval(bin->lhs());
    const Expr *divisor = maybeEval(bin->rhs());

    if (divisor->op() == TO_LITERAL) {
      const LiteralExpr *rhs = divisor->asLiteral();
      if (rhs->raw() == 0) {
        report(bin, DiagnosticsId::DI_DIV_BY_ZERO);
        return;
      }
      if (divided->op() == TO_LITERAL) {
        const LiteralExpr *lhs = divided->asLiteral();
        if (lhs->kind() == LK_INT && rhs->kind() == LK_INT) {
          if (rhs->i() == -1 && lhs->i() == MIN_SQ_INTEGER) {
            report(bin, DiagnosticsId::DI_INTEGER_OVERFLOW);
          }
          else if (lhs->i() % rhs->i() != 0) {
            report(bin, DiagnosticsId::DI_ROUND_TO_INT);
          }
        }
      }
    }
  }
}